

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int act_swap_hdrs(nt_opts *opts)

{
  int iVar1;
  nifti_1_header *h;
  nifti_image *nim;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  uint is_nifti;
  long lVar5;
  char *fname;
  int swap;
  char func [13];
  int local_5c;
  int *local_58;
  int *local_50;
  char *local_48;
  undefined5 local_40;
  undefined3 local_3b;
  undefined5 uStack_38;
  
  uStack_38 = 0x73726468;
  local_40 = 0x6d5f746361;
  local_3b = 0x5f646f;
  local_5c = opts->swap_ana + opts->swap_hdr + opts->swap_old;
  if (local_5c < 2) {
    iVar1 = 0;
    if (local_5c != 0) {
      if (2 < g_debug) {
        act_swap_hdrs_cold_1();
      }
      iVar1 = 0;
      if (0 < (opts->infiles).len) {
        local_50 = &opts->swap_ana;
        local_58 = &opts->swap_old;
        local_48 = opts->command;
        lVar5 = 0;
        do {
          fname = (opts->infiles).list[lVar5];
          iVar1 = nifti_is_gzfile(fname);
          if (iVar1 == 0) {
            h = nt_read_header(opts,fname,&local_5c,0);
            if (h == (nifti_1_header *)0x0) {
              return 1;
            }
            if (1 < g_debug) {
              act_swap_hdrs_cold_2();
            }
            if (local_5c == 0) {
              if (*local_58 == 0) {
                uVar4 = (uint)(*local_50 == 0);
                goto LAB_0010b11f;
              }
              uVar4 = 0;
              if ((((h->magic[0] == 'n') && (h->magic[3] == '\0')) &&
                  ((uVar4 = 0, h->magic[1] == 'i' || (h->magic[1] == '+')))) &&
                 ((byte)(h->magic[2] - 0x31U) < 9)) {
                uVar4 = (uint)(byte)(h->magic[2] - 0x30);
              }
LAB_0010b1db:
              old_swap_nifti_header(h,uVar4);
            }
            else {
              if (((((*local_50 == 0) || (h->magic[0] != 'n')) || (h->magic[3] != '\0')) ||
                  ((h->magic[1] != 'i' && (h->magic[1] != '+')))) ||
                 (8 < (byte)(h->magic[2] - 0x31U))) {
                if ((opts->swap_hdr == 0) ||
                   ((((h->magic[0] == 'n' && (h->magic[3] == '\0')) &&
                     ((h->magic[1] == 'i' || (h->magic[1] == '+')))) &&
                    ((byte)(h->magic[2] - 0x31U) < 9)))) {
                  if (*local_58 != 0) {
                    uVar4 = 0;
                    is_nifti = 0;
                    if ((((h->magic[0] == 'n') && (h->magic[3] == '\0')) &&
                        ((h->magic[1] == 'i' || (h->magic[1] == '+')))) &&
                       ((byte)(h->magic[2] - 0x31U) < 9)) {
                      is_nifti = (uint)(byte)(h->magic[2] - 0x30);
                    }
                    swap_nifti_header(h,is_nifti);
                    if (((h->magic[0] == 'n') && (h->magic[3] == '\0')) &&
                       (((h->magic[1] == 'i' || (h->magic[1] == '+')) &&
                        (uVar4 = 0, (byte)(h->magic[2] - 0x31U) < 9)))) {
                      uVar4 = (uint)(byte)(h->magic[2] - 0x30);
                    }
                    goto LAB_0010b1db;
                  }
                  goto LAB_0010b1e0;
                }
                swap_nifti_header(h,0);
                uVar4 = 1;
              }
              else {
                swap_nifti_header(h,1);
                uVar4 = 0;
              }
LAB_0010b11f:
              swap_nifti_header(h,uVar4);
            }
LAB_0010b1e0:
            if (opts->prefix == (char *)0x0) {
              pcVar3 = (char *)0x0;
            }
            else {
              nim = nt_image_read(opts,fname,1);
              pcVar3 = local_48;
              if (nim == (nifti_image *)0x0) {
                fprintf(_stderr,"** failed to dup file \'%s\' before modifying\n",fname);
                return 1;
              }
              if (opts->keep_hist != 0) {
                sVar2 = strlen(local_48);
                iVar1 = nifti_add_extension(nim,pcVar3,(int)sVar2,6);
                if (iVar1 != 0) {
                  act_swap_hdrs_cold_3();
                }
              }
              iVar1 = nifti_set_filenames(nim,opts->prefix,1,1);
              if (iVar1 != 0) {
                fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",&local_40,
                        "failed to set prefix for new file: ",opts->prefix);
                nifti_image_free(nim);
                return 1;
              }
              pcVar3 = nifti_strdup(nim->fname);
              nifti_image_write(nim);
              if (0x15b < nim->iname_offset) {
                h->vox_offset = (float)nim->iname_offset;
              }
              nifti_image_free(nim);
              fname = pcVar3;
            }
            write_hdr_to_file(h,fname);
            if (pcVar3 != (char *)0x0) {
              free(pcVar3);
            }
            free(h);
          }
          else {
            fprintf(_stderr,"** sorry, cannot swap a gzipped header: %s\n",fname);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (opts->infiles).len);
        iVar1 = 0;
      }
    }
  }
  else {
    act_swap_hdrs_cold_4();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int act_swap_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr;
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec, swap;
   char           * fname, * dupname;
   char             func[] = { "act_mod_hdrs" };

   /* count requested operations: "there can be only one", and not Sean */
   swap = opts->swap_hdr + opts->swap_ana + opts->swap_old;
   if( swap > 1 ) {
      fprintf(stderr,"** can perform only one swap method\n");
      return 1;
   } else if( ! swap )
      return 0; /* probably shouldn't be here */

   if( g_debug > 2 )
      fprintf(stderr,"-d swapping headers of %d files...\n",opts->infiles.len);

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      fname = opts->infiles.list[filec];  /* for convenience and mod file */

      if( nifti_is_gzfile(fname) ){
         fprintf(stderr,"** sorry, cannot swap a gzipped header: %s\n", fname);
         continue;
      }

      /* do not validate the header structure */
      nhdr = nt_read_header(opts, fname, &swap, 0);
      if( !nhdr ) return 1;

      if( g_debug > 1 ) {
         char * str = "NIfTI";
         if( opts->swap_ana || (opts->swap_old && !NIFTI_VERSION(*nhdr)) )
            str = "ANALYZE";
         fprintf(stderr,"-d %sswapping %s header of file %s\n",
                 opts->swap_old ? "OLD " : "", str, fname);
      }

      if( ! swap ) {    /* if not yet swapped, do as the user requested */

         if( opts->swap_old ) old_swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
         else                 swap_nifti_header(nhdr, opts->swap_ana ? 0 : 1);

      } else {          /* swapped already: if not correct, need to undo */

         /* if swapped the wrong way, undo and swap as the user requested */
         if ( opts->swap_ana && NIFTI_VERSION(*nhdr) ) {
            /* want swapped as ANALYZE, but was swapped as NIFTI */
            swap_nifti_header(nhdr, 1);  /* undo NIFTI */
            swap_nifti_header(nhdr, 0);  /* swap ANALYZE */
         } else if( opts->swap_hdr && !NIFTI_VERSION(*nhdr) ) {
            /* want swapped as NIFTI, but was swapped as ANALYZE */
            swap_nifti_header(nhdr, 0);  /* undo ANALYZE */
            swap_nifti_header(nhdr, 1);  /* swap NIFTI */
         } else if ( opts->swap_old ) {
            /* undo whichever was done and apply the old way */
            swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
            old_swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));
         }

         /* else it was swapped the right way to begin with */

      }

      dupname = NULL;                     /* unless we duplicate file   */

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
      {
         nim = nt_image_read(opts, fname, 1); /* get data */
         if( !nim ) {
            fprintf(stderr,"** failed to dup file '%s' before modifying\n",
                    fname);
            return 1;
         }
         if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                                strlen(opts->command), NIFTI_ECODE_COMMENT) )
               fprintf(stderr,"** failed to add command to image as exten\n");
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }
         dupname = nifti_strdup(nim->fname);  /* so we know to free it */
         fname = dupname;
         nifti_image_write(nim);  /* create the duplicate file */
         /* if we added a history note, get the new offset into the header */
         /* mod: if the new offset is valid, use it    31 Jan 2006 [rickr] */
         if( nim->iname_offset >= 348 ) nhdr->vox_offset = nim->iname_offset;
         nifti_image_free(nim);
      }

      /* if all is well, overwrite header in fname dataset */
      (void)write_hdr_to_file(nhdr, fname); /* errors printed in function */

      if( dupname ) free(dupname);
      free(nhdr);
   }

   return 0;
}